

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O3

bool __thiscall
VmaBlockMetadata_Linear::CreateAllocationRequest_UpperAddress
          (VmaBlockMetadata_Linear *this,VkDeviceSize allocSize,VkDeviceSize allocAlignment,
          VmaSuballocationType allocType,uint32_t strategy,VmaAllocationRequest *pAllocationRequest)

{
  ulong uVar1;
  VmaSuballocation *pVVar2;
  bool bVar3;
  size_t sVar4;
  VmaSuballocationType VVar5;
  VmaSuballocationType *pVVar6;
  ulong uVar7;
  VmaSuballocationType VVar8;
  bool bVar9;
  
  uVar7 = (this->super_VmaBlockMetadata).m_Size;
  bVar9 = this->m_1stVectorIndex == 0;
  bVar3 = !bVar9;
  if (uVar7 < allocSize) {
    return false;
  }
  if (this->m_2ndVectorMode == SECOND_VECTOR_RING_BUFFER) {
    return false;
  }
  uVar1 = (this->super_VmaBlockMetadata).m_BufferImageGranularity;
  sVar4 = (&this->m_Suballocations0)[bVar9].m_Count;
  if ((sVar4 == 0) ||
     (uVar7 = (&this->m_Suballocations0)[bVar9].m_pArray[sVar4 - 1].offset, allocSize <= uVar7)) {
    uVar7 = -allocAlignment & uVar7 - allocSize;
    if ((1 < uVar1) && ((uVar1 != allocAlignment && (sVar4 != 0)))) {
      pVVar6 = &(&this->m_Suballocations0)[bVar9].m_pArray[sVar4 - 1].type;
      do {
        if (((((VmaSuballocation *)(pVVar6 + -6))->offset ^ (allocSize + uVar7) - 1) & -uVar1) != 0)
        break;
        VVar8 = *pVVar6;
        VVar5 = allocType;
        if ((int)VVar8 < (int)allocType) {
          VVar5 = VVar8;
        }
        if ((int)VVar8 <= (int)allocType) {
          VVar8 = allocType;
        }
        switch(VVar5) {
        case VMA_SUBALLOCATION_TYPE_FREE:
        case VMA_SUBALLOCATION_TYPE_IMAGE_OPTIMAL:
          break;
        default:
          goto switchD_001b7d96_caseD_1;
        case VMA_SUBALLOCATION_TYPE_BUFFER:
          if (VVar8 != VMA_SUBALLOCATION_TYPE_IMAGE_UNKNOWN) goto switchD_001b7d96_caseD_4;
          goto switchD_001b7d96_caseD_1;
        case VMA_SUBALLOCATION_TYPE_IMAGE_UNKNOWN:
          if (VVar8 - VMA_SUBALLOCATION_TYPE_IMAGE_UNKNOWN < 3) goto switchD_001b7d96_caseD_1;
          break;
        case VMA_SUBALLOCATION_TYPE_IMAGE_LINEAR:
switchD_001b7d96_caseD_4:
          if (VVar8 == VMA_SUBALLOCATION_TYPE_IMAGE_OPTIMAL) goto switchD_001b7d96_caseD_1;
        }
        sVar4 = sVar4 - 1;
        pVVar6 = pVVar6 + -8;
      } while (sVar4 != 0);
    }
LAB_001b7dbe:
    sVar4 = (&this->m_Suballocations0)[bVar3].m_Count;
    if (sVar4 != 0) {
      pVVar2 = (&this->m_Suballocations0)[bVar3].m_pArray;
      if (uVar7 < pVVar2[sVar4 - 1].size + pVVar2[sVar4 - 1].offset) goto LAB_001b7de7;
      if (1 < uVar1) {
        pVVar6 = &(&this->m_Suballocations0)[bVar3].m_pArray[sVar4 - 1].type;
        do {
          if ((((((VmaSuballocation *)(pVVar6 + -6))->offset + *(undefined8 *)(pVVar6 + -4)) - 1 ^
               uVar7) & -uVar1) != 0) break;
          VVar8 = *pVVar6;
          VVar5 = VVar8;
          if ((int)allocType < (int)VVar8) {
            VVar5 = allocType;
          }
          if ((int)VVar8 < (int)allocType) {
            VVar8 = allocType;
          }
          bVar3 = false;
          switch(VVar5) {
          case VMA_SUBALLOCATION_TYPE_FREE:
          case VMA_SUBALLOCATION_TYPE_IMAGE_OPTIMAL:
            break;
          default:
            goto switchD_001b7e3e_caseD_1;
          case VMA_SUBALLOCATION_TYPE_BUFFER:
            if (VVar8 == VMA_SUBALLOCATION_TYPE_IMAGE_UNKNOWN) {
              return false;
            }
            if (VVar8 == VMA_SUBALLOCATION_TYPE_IMAGE_OPTIMAL) {
              return false;
            }
            break;
          case VMA_SUBALLOCATION_TYPE_IMAGE_UNKNOWN:
            if (VVar8 - VMA_SUBALLOCATION_TYPE_IMAGE_UNKNOWN < 3) goto LAB_001b7de7;
            break;
          case VMA_SUBALLOCATION_TYPE_IMAGE_LINEAR:
            if (VVar8 == VMA_SUBALLOCATION_TYPE_IMAGE_OPTIMAL) goto LAB_001b7de7;
          }
          sVar4 = sVar4 - 1;
          pVVar6 = pVVar6 + -8;
        } while (sVar4 != 0);
      }
    }
    pAllocationRequest->allocHandle = (VmaAllocHandle)(uVar7 + 1);
    pAllocationRequest->type = UpperAddress;
    bVar3 = true;
  }
  else {
LAB_001b7de7:
    bVar3 = false;
  }
switchD_001b7e3e_caseD_1:
  return bVar3;
switchD_001b7d96_caseD_1:
  uVar7 = uVar7 & -uVar1;
  goto LAB_001b7dbe;
}

Assistant:

VkDeviceSize GetSize() const { return m_Size; }